

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

bool __thiscall libtorrent::settings_pack::has_val(settings_pack *this,int name)

{
  bool bVar1;
  uint uVar2;
  const_iterator __first;
  const_iterator __last;
  pointer ppVar3;
  const_iterator __first_00;
  const_iterator __last_00;
  pointer ppVar4;
  size_type sVar5;
  pointer ppVar6;
  bool local_123;
  bool local_122;
  bool local_121;
  __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  local_f8;
  pair<unsigned_short,_bool> *local_f0;
  __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  local_e8;
  __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  local_e0;
  __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  i_2;
  const_iterator cStack_d0;
  pair<unsigned_short,_bool> v_2;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  local_b8;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  i_1;
  pair<unsigned_short,_int> local_a8;
  pair<unsigned_short,_int> v_1;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  unsigned_short local_4a;
  undefined1 local_48 [8];
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  int name_local;
  settings_pack *this_local;
  
  uVar2 = name & 0xc000;
  v.second.field_2._12_4_ = name;
  if (uVar2 == 0) {
    sVar5 = ::std::
            vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&this->m_strings);
    if (sVar5 == 0xd) {
      this_local._7_1_ = true;
    }
    else {
      local_4a = libtorrent::aux::numeric_cast<unsigned_short,int,void>(v.second.field_2._12_4_);
      ::std::__cxx11::string::string((string *)&local_70);
      ::std::
      pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_48,&local_4a,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      __first = ::std::
                vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::begin(&this->m_strings);
      __last = ::std::
               vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(&this->m_strings);
      local_88 = ::std::
                 lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>const*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>,std::pair<unsigned_short,std::__cxx11::string>,bool(*)(std::pair<unsigned_short,std::__cxx11::string>const&,std::pair<unsigned_short,std::__cxx11::string>const&)>
                           (__first._M_current,__last._M_current,
                            (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_48,::(anonymous_namespace)::compare_first<std::__cxx11::string>
                           );
      v_1 = (pair<unsigned_short,_int>)
            ::std::
            vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&this->m_strings);
      bVar1 = __gnu_cxx::operator!=
                        (&local_88,
                         (__normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&v_1);
      local_121 = false;
      if (bVar1) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->(&local_88);
        local_121 = (uint)ppVar3->first == v.second.field_2._12_4_;
      }
      this_local._7_1_ = local_121;
      ::std::
      pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_48);
    }
  }
  else if (uVar2 == 0x4000) {
    sVar5 = ::std::
            vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
            ::size(&this->m_ints);
    if (sVar5 == 0x9f) {
      this_local._7_1_ = true;
    }
    else {
      i_1._M_current._6_2_ =
           libtorrent::aux::numeric_cast<unsigned_short,int,void>(v.second.field_2._12_4_);
      i_1._M_current._0_4_ = 0;
      ::std::pair<unsigned_short,_int>::pair<unsigned_short,_int,_true>
                (&local_a8,(unsigned_short *)((long)&i_1._M_current + 6),(int *)&i_1);
      __first_00 = ::std::
                   vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                   ::begin(&this->m_ints);
      __last_00 = ::std::
                  vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                  ::end(&this->m_ints);
      local_b8 = ::std::
                 lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,int>const*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>,std::pair<unsigned_short,int>,bool(*)(std::pair<unsigned_short,int>const&,std::pair<unsigned_short,int>const&)>
                           (__first_00._M_current,__last_00._M_current,&local_a8,
                            anon_unknown.dwarf_c13c2b::compare_first<int>);
      cStack_d0 = ::std::
                  vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                  ::end(&this->m_ints);
      bVar1 = __gnu_cxx::operator!=(&local_b8,&stack0xffffffffffffff30);
      local_122 = false;
      if (bVar1) {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
                 ::operator->(&local_b8);
        local_122 = (uint)ppVar4->first == v.second.field_2._12_4_;
      }
      this_local._7_1_ = local_122;
    }
  }
  else if (uVar2 == 0x8000) {
    sVar5 = ::std::
            vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
            ::size(&this->m_bools);
    if (sVar5 == 0x54) {
      this_local._7_1_ = true;
    }
    else {
      i_2._M_current._2_2_ =
           libtorrent::aux::numeric_cast<unsigned_short,int,void>(v.second.field_2._12_4_);
      i_2._M_current._1_1_ = 0;
      ::std::pair<unsigned_short,_bool>::pair<unsigned_short,_bool,_true>
                ((pair<unsigned_short,_bool> *)((long)&i_2._M_current + 4),
                 (unsigned_short *)((long)&i_2._M_current + 2),(bool *)((long)&i_2._M_current + 1));
      local_e8._M_current =
           (pair<unsigned_short,_bool> *)
           ::std::
           vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
           ::begin(&this->m_bools);
      local_f0 = (pair<unsigned_short,_bool> *)
                 ::std::
                 vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                 ::end(&this->m_bools);
      local_e0 = ::std::
                 lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,bool>const*,std::vector<std::pair<unsigned_short,bool>,std::allocator<std::pair<unsigned_short,bool>>>>,std::pair<unsigned_short,bool>,bool(*)(std::pair<unsigned_short,bool>const&,std::pair<unsigned_short,bool>const&)>
                           (local_e8,(__normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
                                      )local_f0,
                            (pair<unsigned_short,_bool> *)((long)&i_2._M_current + 4),
                            anon_unknown.dwarf_c13c2b::compare_first<bool>);
      local_f8._M_current =
           (pair<unsigned_short,_bool> *)
           ::std::
           vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
           ::end(&this->m_bools);
      bVar1 = __gnu_cxx::operator!=(&local_e0,&local_f8);
      local_123 = false;
      if (bVar1) {
        ppVar6 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
                 ::operator->(&local_e0);
        local_123 = (uint)ppVar6->first == v.second.field_2._12_4_;
      }
      this_local._7_1_ = local_123;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool settings_pack::has_val(int const name) const
	{
		switch (name & type_mask)
		{
			case string_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_strings.size() == settings_pack::num_string_settings)
					return true;
				std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
				auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
						, &compare_first<std::string>);
				return i != m_strings.end() && i->first == name;
			}
			case int_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_ints.size() == settings_pack::num_int_settings)
					return true;
				std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
				auto i = std::lower_bound(m_ints.begin(), m_ints.end(), v
						, &compare_first<int>);
				return i != m_ints.end() && i->first == name;
			}
			case bool_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_bools.size() == settings_pack::num_bool_settings)
					return true;
				std::pair<std::uint16_t, bool> v(aux::numeric_cast<std::uint16_t>(name), false);
				auto i = std::lower_bound(m_bools.begin(), m_bools.end(), v
						, &compare_first<bool>);
				return i != m_bools.end() && i->first == name;
			}
		}
		TORRENT_ASSERT_FAIL();
		return false;
	}